

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btHashString>::push_back
          (btAlignedObjectArray<btHashString> *this,btHashString *_Val)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  btHashString *pbVar4;
  btAlignedObjectArray<btHashString> *in_RSI;
  btAlignedObjectArray<btHashString> *in_RDI;
  int sz;
  int _Count;
  
  iVar2 = size(in_RDI);
  _Count = iVar2;
  iVar3 = capacity(in_RDI);
  if (iVar2 == iVar3) {
    iVar2 = size(in_RDI);
    allocSize(in_RDI,iVar2);
    reserve(in_RSI,_Count);
  }
  pbVar4 = in_RDI->m_data + in_RDI->m_size;
  pbVar4->m_string = *(char **)in_RSI;
  uVar1 = *(undefined4 *)&in_RSI->field_0xc;
  pbVar4->m_hash = in_RSI->m_capacity;
  *(undefined4 *)&pbVar4->field_0xc = uVar1;
  in_RDI->m_size = in_RDI->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}